

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall Heap<int>::heapify(Heap<int> *this,int i)

{
  int iVar1;
  _func_bool_int_int *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference b;
  int right;
  int left;
  int index;
  undefined1 local_68 [8];
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  int i_local;
  Heap<int> *this_local;
  
  s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _4_4_ = i;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)local_68);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,
             (value_type *)
             ((long)&s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                     ._M_finish._M_node + 4));
  while (bVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                       ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    right = *pvVar6;
    iVar4 = right * 2 + 1;
    iVar5 = right * 2 + 2;
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->arr);
    iVar1 = right;
    if ((ulong)(long)iVar4 < sVar7 >> 1) {
      p_Var2 = this->compare;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)iVar4);
      iVar1 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)right);
      bVar3 = (*p_Var2)(iVar1,*pvVar8);
      iVar1 = iVar4;
      if (!bVar3) {
        iVar1 = right;
      }
    }
    right = iVar1;
    sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->arr);
    iVar1 = right;
    if ((ulong)(long)iVar5 < sVar7 >> 1) {
      p_Var2 = this->compare;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)iVar5);
      iVar1 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)right);
      bVar3 = (*p_Var2)(iVar1,*pvVar8);
      iVar1 = iVar5;
      if (!bVar3) {
        iVar1 = right;
      }
    }
    right = iVar1;
    iVar1 = right;
    pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                       ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    if (iVar1 != *pvVar6) {
      pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                         ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)*pvVar6);
      b = std::vector<int,_std::allocator<int>_>::operator[](&this->arr,(long)right);
      Swap<int>(pvVar8,b);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&right);
    }
  }
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  return;
}

Assistant:

void heapify(int i) {
        std::stack<int> s;
        s.push(i);

        while (!s.empty()) {
            int index = s.top();

            int left = 2 * index + 1;
            int right = 2 * index + 2;

            if (left < arr.size() / 2 && compare(arr[left], arr[index])) {
                index = left;
            }

            if (right < arr.size() / 2 && compare(arr[right], arr[index])) {
                index = right;
            }

            if (index != s.top()) {
                Swap(arr[s.top()], arr[index]);
                s.pop();

                s.push(index);
            }
        }
    }